

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsInstPrinter.c
# Opt level: O0

void printMemOperandEA(MCInst *MI,int opNum,SStream *O)

{
  char *in_RDX;
  undefined4 in_ESI;
  undefined4 in_stack_fffffffffffffff0;
  
  printOperand(MI,opNum,O);
  SStream_concat0((SStream *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX);
  printOperand(MI,opNum,O);
  return;
}

Assistant:

static void printMemOperandEA(MCInst *MI, int opNum, SStream *O)
{
	// when using stack locations for not load/store instructions
	// print the same way as all normal 3 operand instructions.
	printOperand(MI, opNum, O);
	SStream_concat0(O, ", ");
	printOperand(MI, opNum + 1, O);
	return;
}